

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_string_sub(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  int iVar1;
  gravity_object_t *pgVar2;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  uint uVar3;
  uint uVar4;
  gravity_fiber_t *pgVar5;
  char *__s;
  size_t sVar6;
  char *s_00;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar7;
  gravity_value_t gVar8;
  uint local_2124;
  gravity_string_t *string;
  uint32_t len;
  uint32_t seek;
  char *s;
  uint32_t alloc;
  char local_20b8 [8];
  char _buffer_1 [4096];
  uint32_t flen;
  char *found;
  gravity_string_t *s2;
  gravity_string_t *s1;
  char local_1058 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_50;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar2 = (args->field_1).p;
  join_0x00000010_0x00000000_ = convert_value2string(vm,args[1]);
  aVar7.n = local_50.n;
  if (_buffer._4088_8_ == 0) {
    snprintf(local_1058,0x1000,"Unable to convert object to String");
    pgVar5 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar5,local_1058);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
    vm_local._7_1_ = false;
  }
  else if (*(int *)((long)&(local_50.p)->identifier + 4) == 0) {
    gVar8 = gravity_string_to_value(vm,(char *)pgVar2->objclass,0xffffffff);
    gravity_vm_setslot(vm,gVar8,rindex);
    vm_local._7_1_ = true;
  }
  else {
    __s = string_strnstr((char *)pgVar2->objclass,(char *)(local_50.p)->objclass,
                         (ulong)*(uint *)((long)&pgVar2->identifier + 4));
    if (__s == (char *)0x0) {
      gVar8 = gravity_string_to_value
                        (vm,(char *)pgVar2->objclass,*(uint32_t *)((long)&pgVar2->identifier + 4));
      gravity_vm_setslot(vm,gVar8,rindex);
      vm_local._7_1_ = true;
    }
    else {
      sVar6 = strlen(__s);
      uVar3 = (uint)sVar6;
      if (uVar3 == *(uint *)((long)&(aVar7.p)->identifier + 4)) {
        join_0x00000010_0x00000000_ =
             gravity_string_to_value(vm,(char *)pgVar2->objclass,(int)__s - (int)pgVar2->objclass);
        gravity_vm_setslot(vm,join_0x00000010_0x00000000_,rindex);
        vm_local._7_1_ = true;
      }
      else if (uVar3 < *(uint *)((long)&(aVar7.p)->identifier + 4)) {
        snprintf(local_20b8,0x1000,"Malformed string.");
        pgVar5 = gravity_vm_fiber(vm);
        gravity_fiber_seterror(pgVar5,local_20b8);
        value_00.field_1.n = 0;
        value_00.isa = gravity_class_null;
        gravity_vm_setslot(vm,value_00,rindex);
        vm_local._7_1_ = false;
      }
      else {
        if (*(int *)((long)&pgVar2->identifier + 4) + *(int *)((long)&(aVar7.p)->identifier + 4) +
            1U < 0x21) {
          local_2124 = 0x20;
        }
        else {
          local_2124 = *(int *)((long)&pgVar2->identifier + 4) +
                       *(int *)((long)&(aVar7.p)->identifier + 4) + 1;
        }
        s_00 = (char *)gravity_calloc(vm,1,(ulong)local_2124);
        if (s_00 == (char *)0x0) {
          value.field_1.n = 0;
          value.isa = gravity_class_null;
          gravity_vm_setslot(vm,value,rindex);
          vm_local._7_1_ = false;
        }
        else {
          uVar4 = (int)__s - (int)pgVar2->objclass;
          iVar1 = *(int *)((long)&(aVar7.p)->identifier + 4);
          memcpy(s_00,pgVar2->objclass,(ulong)uVar4);
          memcpy(s_00 + uVar4,__s + *(uint *)((long)&(aVar7.p)->identifier + 4),
                 (ulong)(uVar3 - *(int *)((long)&(aVar7.p)->identifier + 4)));
          aVar7.p = (gravity_object_t *)
                    gravity_string_new(vm,s_00,uVar4 + (uVar3 - iVar1),local_2124);
          gVar8.field_1.p = (gravity_object_t *)aVar7.n;
          gVar8.isa = (aVar7.p)->isa;
          gravity_vm_setslot(vm,gVar8,rindex);
          vm_local._7_1_ = true;
        }
      }
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool operator_string_sub (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    gravity_string_t *s2 = VALUE_AS_STRING(v2);
    
    // special case
    if (s2->len == 0) {
        RETURN_VALUE(VALUE_FROM_CSTRING(vm, s1->s), rindex);
    }
    
    // subtract s2 from s1
    char *found = string_strnstr(s1->s, s2->s, (size_t)s1->len);
    if (!found) RETURN_VALUE(VALUE_FROM_STRING(vm, s1->s, s1->len), rindex);

    // substring found
    // now check if entire substring must be considered
    uint32_t flen = (uint32_t)strlen(found);
    if (flen == s2->len) RETURN_VALUE(VALUE_FROM_STRING(vm, s1->s, (uint32_t)(found - s1->s)), rindex);
    // sanity check for malformed strings
    if (flen < s2->len) RETURN_ERROR("Malformed string.");

    // substring found but cannot be entirely considered
    uint32_t alloc = MAXNUM(s1->len + s2->len +1, DEFAULT_MINSTRING_SIZE);
    char *s = mem_alloc(vm, alloc);
    CHECK_MEM_ALLOC(s);

    uint32_t seek = (uint32_t)(found - s1->s);
    uint32_t len = seek + (flen - s2->len);
    memcpy(s, s1->s, seek);
    memcpy(s+seek, found+s2->len, flen - s2->len);

    gravity_string_t *string = gravity_string_new(vm, s, len, alloc);
    RETURN_VALUE(VALUE_FROM_OBJECT(string), rindex);
}